

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

bool sptk::ReadStream<signed_char>
               (bool zero_padding,int stream_skip,int read_point,int read_size,
               vector<signed_char,_std::allocator<signed_char>_> *sequence_to_read,
               istream *input_stream,int *actual_read_size)

{
  int iVar1;
  long lVar2;
  ulong __new_size;
  uint uVar3;
  bool bVar4;
  
  if (((input_stream == (istream *)0x0 ||
       sequence_to_read == (vector<signed_char,_std::allocator<signed_char>_> *)0x0) ||
       (read_size < 1 || (read_point | stream_skip) < 0)) ||
     (((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) != 0)) {
LAB_001044f3:
    bVar4 = false;
  }
  else {
    if (0 < stream_skip) {
      std::istream::ignore((long)input_stream);
      if (((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) != 0)
      goto LAB_001044f3;
    }
    __new_size = (ulong)(uint)(read_size + read_point);
    lVar2 = *(long *)sequence_to_read;
    if ((ulong)(*(long *)(sequence_to_read + 8) - lVar2) < __new_size) {
      std::vector<signed_char,_std::allocator<signed_char>_>::resize(sequence_to_read,__new_size);
      lVar2 = *(long *)sequence_to_read;
    }
    std::istream::read((char *)input_stream,(ulong)(uint)read_point + lVar2);
    iVar1 = *(int *)(input_stream + 8);
    if (actual_read_size != (int *)0x0) {
      *actual_read_size = iVar1;
    }
    if (read_size == iVar1) {
      uVar3 = 5;
    }
    else {
      if ((!zero_padding || iVar1 < 1) || (uVar3 = read_size - iVar1, (int)uVar3 < 0))
      goto LAB_001044f3;
      memset((void *)((__new_size + *(long *)sequence_to_read) - (ulong)uVar3),0,(ulong)uVar3);
      uVar3 = 1;
    }
    bVar4 = (*(uint *)(input_stream + *(long *)(*(long *)input_stream + -0x18) + 0x20) & uVar3) == 0
    ;
  }
  return bVar4;
}

Assistant:

bool ReadStream(bool zero_padding, int stream_skip, int read_point,
                int read_size, std::vector<T>* sequence_to_read,
                std::istream* input_stream, int* actual_read_size) {
  if (stream_skip < 0 || read_point < 0 || read_size <= 0 ||
      NULL == sequence_to_read || NULL == input_stream || input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof((*sequence_to_read)[0]));

  if (0 < stream_skip) {
    input_stream->ignore(type_byte * stream_skip);
    if (input_stream->eof()) return false;
  }

  const int end(read_point + read_size);
  if (sequence_to_read->size() < static_cast<std::size_t>(end)) {
    sequence_to_read->resize(end);
  }

  const int num_read_bytes(type_byte * read_size);
  input_stream->read(
      reinterpret_cast<char*>(&((*sequence_to_read)[0]) + read_point),
      num_read_bytes);

  const int gcount(static_cast<int>(input_stream->gcount()));
  if (NULL != actual_read_size) {
    *actual_read_size = gcount / type_byte;
  }

  if (num_read_bytes == gcount) {
    return !input_stream->fail();
  } else if (zero_padding && 0 < gcount) {
    // Use std::ceil to zero incomplete data
    // as gcount may not be a multiple of sizeof(double).
    const int num_zeros(static_cast<int>(
        std::ceil(static_cast<double>(num_read_bytes - gcount) / type_byte)));
    if (num_zeros < 0) {
      return false;  // Something wrong!
    }

    std::fill_n(sequence_to_read->begin() + end - num_zeros, num_zeros,
                static_cast<T>(0));

    return !input_stream->bad();
  }

  return false;
}